

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void tcu::x11::glx::checkGlxExtension(GlxDisplay *dpy,char *extName)

{
  bool bVar1;
  ostream *poVar2;
  NotSupportedError *this;
  char *message;
  ostringstream local_190 [8];
  ostringstream oss;
  char *extName_local;
  GlxDisplay *dpy_local;
  
  oss._368_8_ = extName;
  bVar1 = GlxDisplay::isGlxExtensionSupported(dpy,extName);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"GLX extension \"");
    poVar2 = std::operator<<(poVar2,(char *)oss._368_8_);
    std::operator<<(poVar2,"\" not supported");
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    message = (char *)std::__cxx11::string::c_str();
    NotSupportedError::NotSupportedError
              (this,message,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x112);
    __cxa_throw(this,&NotSupportedError::typeinfo,NotSupportedError::~NotSupportedError);
  }
  return;
}

Assistant:

static void checkGlxExtension (const GlxDisplay& dpy, const char* extName)
{
	if (!dpy.isGlxExtensionSupported(extName))
	{
		ostringstream oss;
		oss << "GLX extension \"" << extName << "\" not supported";
		TCU_THROW(NotSupportedError, oss.str().c_str());
	}
}